

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgraphelq3dd.cpp
# Opt level: O3

int64_t __thiscall TPZGraphElQ3dd::EqNum(TPZGraphElQ3dd *this,TPZVec<int> *co)

{
  int *piVar1;
  int64_t iVar2;
  int iVar3;
  long lVar4;
  
  lVar4 = (long)(1 << ((byte)((this->super_TPZGraphEl).fGraphMesh)->fResolution & 0x1f)) + 1;
  iVar2 = TPZGraphNode::FirstPoint(this->fConnect);
  iVar3 = (int)lVar4;
  piVar1 = co->fStore;
  return iVar2 + piVar1[1] * lVar4 + (long)*piVar1 + (ulong)(uint)(iVar3 * iVar3) * (long)piVar1[2];
}

Assistant:

int64_t TPZGraphElQ3dd::EqNum(TPZVec<int> &co) {
	int res = fGraphMesh->Res();
	int imax = (1<<res)+1;
	
	return fConnect->FirstPoint()+imax*imax*co[2]+co[1]*imax+co[0];
}